

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O3

void nvlist_move_nvlist_array(nvlist_t *nvl,char *name,nvlist_t **value,size_t nitems)

{
  nvlist_t *pnVar1;
  nvlist_t *pnVar2;
  int *piVar3;
  nvpair_t *nvp;
  int iVar4;
  size_t sVar5;
  
  if (nvl != (nvlist_t *)0x0) {
    if (nvl->nvl_magic != 0x6e766c) goto LAB_0010a540;
    if (nvl->nvl_error == 0) {
      nvp = nvpair_move_nvlist_array(name,value,nitems);
      if (nvp == (nvpair_t *)0x0) {
        piVar3 = __errno_location();
        iVar4 = 0xc;
        if (*piVar3 != 0) {
          iVar4 = *piVar3;
        }
        nvl->nvl_error = iVar4;
        *piVar3 = iVar4;
        return;
      }
      nvlist_move_nvpair(nvl,nvp);
      return;
    }
  }
  if (nitems != 0 && value != (nvlist_t **)0x0) {
    sVar5 = 0;
    do {
      pnVar2 = value[sVar5];
      pnVar1 = nvlist_get_array_next(pnVar2);
      if ((pnVar1 == (nvlist_t *)0x0) &&
         (pnVar2 = nvlist_get_parent(pnVar2,(void **)0x0), pnVar2 == (nvlist_t *)0x0)) {
        nvlist_destroy(value[sVar5]);
      }
      sVar5 = sVar5 + 1;
    } while (nitems != sVar5);
  }
  free(value);
  if (nvl == (nvlist_t *)0x0) {
    iVar4 = 0xc;
  }
  else {
    if (nvl->nvl_magic != 0x6e766c) {
LAB_0010a540:
      __assert_fail("(nvl)->nvl_magic == 0x6e766c",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                    ,0xb2,"int nvlist_error(const nvlist_t *)");
    }
    iVar4 = nvl->nvl_error;
  }
  piVar3 = __errno_location();
  *piVar3 = iVar4;
  return;
}

Assistant:

void
nvlist_move_nvlist_array(nvlist_t *nvl, const char *name, nvlist_t **value,
    size_t nitems)
{
	nvpair_t *nvp;
	size_t i;

	if (nvlist_error(nvl) != 0) {
		if (value != NULL) {
			for (i = 0; i < nitems; i++) {
				if (nvlist_get_pararr(value[i], NULL) == NULL)
					nvlist_destroy(value[i]);
			}
		}
		nv_free(value);
		ERRNO_SET(nvlist_error(nvl));
		return;
	}

	nvp = nvpair_move_nvlist_array(name, value, nitems);
	if (nvp == NULL) {
		nvl->nvl_error = ERRNO_OR_DEFAULT(ENOMEM);
		ERRNO_SET(nvl->nvl_error);
	} else {
		(void)nvlist_move_nvpair(nvl, nvp);
	}
}